

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O0

KNearestNeighborsClassifier * __thiscall
CoreML::Specification::Model::mutable_knearestneighborsclassifier(Model *this)

{
  bool bVar1;
  KNearestNeighborsClassifier *this_00;
  Model *this_local;
  
  bVar1 = has_knearestneighborsclassifier(this);
  if (!bVar1) {
    clear_Type(this);
    set_has_knearestneighborsclassifier(this);
    this_00 = (KNearestNeighborsClassifier *)operator_new(0x48);
    KNearestNeighborsClassifier::KNearestNeighborsClassifier(this_00);
    (this->Type_).knearestneighborsclassifier_ = this_00;
  }
  return (KNearestNeighborsClassifier *)(this->Type_).pipelineclassifier_;
}

Assistant:

inline ::CoreML::Specification::KNearestNeighborsClassifier* Model::mutable_knearestneighborsclassifier() {
  if (!has_knearestneighborsclassifier()) {
    clear_Type();
    set_has_knearestneighborsclassifier();
    Type_.knearestneighborsclassifier_ = new ::CoreML::Specification::KNearestNeighborsClassifier;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.kNearestNeighborsClassifier)
  return Type_.knearestneighborsclassifier_;
}